

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_view.hpp
# Opt level: O1

int __thiscall protozero::data_view::compare(data_view *this,data_view other)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  
  uVar3 = other.m_size;
  if ((this->m_data != (char *)0x0) && (other.m_data != (char *)0x0)) {
    uVar1 = this->m_size;
    __n = uVar3;
    if (uVar1 < uVar3) {
      __n = uVar1;
    }
    uVar2 = memcmp(this->m_data,other.m_data,__n);
    if ((uVar2 == 0) && (uVar2 = 0, uVar1 != uVar3)) {
      uVar2 = -(uint)(uVar1 < uVar3) | 1;
    }
    return uVar2;
  }
  __assert_fail("m_data && other.m_data",
                "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/include/protozero/data_view.hpp"
                ,0x91,"int protozero::data_view::compare(data_view) const");
}

Assistant:

int compare(data_view other) const noexcept {
        assert(m_data && other.m_data);
        const int cmp = std::memcmp(data(), other.data(),
                                    std::min(size(), other.size()));
        if (cmp == 0) {
            if (size() == other.size()) {
                return 0;
            }
            return size() < other.size() ? -1 : 1;
        }
        return cmp;
    }